

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O2

size_t aspa_collapse_as_path(uint32_t *as_path,size_t len)

{
  uint32_t *puVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (len == 0) {
    sVar8 = 0;
  }
  else {
    for (sVar4 = 1; sVar8 = len, len != sVar4; sVar4 = sVar4 + 1) {
      if (as_path[sVar4 - 1] == as_path[sVar4]) {
        sVar6 = sVar4;
        if (len != sVar4) goto LAB_00107683;
        break;
      }
    }
  }
LAB_001076c3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return sVar8;
LAB_00107683:
  uVar7 = sVar4 + 1;
  uVar5 = uVar7;
  if (uVar7 < len) {
    uVar5 = len;
  }
  do {
    sVar4 = uVar5;
    if (len <= uVar7) break;
    lVar3 = uVar7 - 1;
    puVar1 = as_path + uVar7;
    sVar4 = uVar7;
    uVar7 = uVar7 + 1;
  } while (as_path[lVar3] == *puVar1);
  sVar8 = sVar6;
  if (sVar4 == len) goto LAB_001076c3;
  as_path[sVar6] = as_path[sVar4];
  sVar6 = sVar6 + 1;
  goto LAB_00107683;
}

Assistant:

RTRLIB_EXPORT size_t aspa_collapse_as_path(uint32_t as_path[], size_t len)
{
	if (len == 0)
		return 0;

	size_t i = 1;

	while (i < len && as_path[i - 1] != as_path[i])
		i++;

	if (i == len)
		return len;

	size_t j = i;

	i++;

	while (true) { // equivalent to while (i < len)
		while (i < len && as_path[i - 1] == as_path[i])
			i++;

		if (i == len)
			break;

		as_path[j++] = as_path[i++];
	}

	return j;
}